

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O2

void __thiscall QOpenGLWindow::resizeEvent(QOpenGLWindow *this,QResizeEvent *event)

{
  int iVar1;
  int iVar2;
  
  QOpenGLWindowPrivate::initialize(*(QOpenGLWindowPrivate **)&this->field_0x8);
  iVar1 = QWindow::width((QWindow *)this);
  iVar2 = QWindow::height((QWindow *)this);
  (**(code **)(*(long *)this + 0x140))(this,iVar1,iVar2,*(code **)(*(long *)this + 0x140));
  return;
}

Assistant:

void QOpenGLWindow::resizeEvent(QResizeEvent *event)
{
    Q_UNUSED(event);
    Q_D(QOpenGLWindow);
    d->initialize();
    resizeGL(width(), height());
}